

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O2

void __thiscall
BayesianGameCollaborativeGraphical::BayesianGameCollaborativeGraphical
          (BayesianGameCollaborativeGraphical *this,BayesianGameCollaborativeGraphical *o)

{
  pointer ppBVar1;
  PDDiscreteInterface *pPVar2;
  BayesianGameIdenticalPayoff *this_00;
  const_reference ppBVar3;
  uint uVar4;
  BayesianGameIdenticalPayoff *local_38;
  
  BayesianGameIdenticalPayoffInterface::BayesianGameIdenticalPayoffInterface
            (&this->super_BayesianGameIdenticalPayoffInterface,
             &o->super_BayesianGameIdenticalPayoffInterface);
  (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameCollaborativeGraphical_005d8300;
  (this->_m_LRFs).
  super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_LRFs).
  super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_LRFs).
  super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_LRFs).
  super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_nrLRFs = o->_m_nrLRFs;
  if (o->_m_jt_pd != (PDDiscreteInterface *)0x0) {
    pPVar2 = (PDDiscreteInterface *)(**(code **)(*(long *)o->_m_jt_pd + 0x40))();
    this->_m_jt_pd = pPVar2;
    ppBVar1 = (this->_m_LRFs).
              super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->_m_LRFs).
        super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppBVar1) {
      (this->_m_LRFs).
      super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppBVar1;
    }
  }
  for (uVar4 = 0;
      (long)(o->_m_LRFs).
            super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(o->_m_LRFs).
            super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)uVar4; uVar4 = uVar4 + 1) {
    this_00 = (BayesianGameIdenticalPayoff *)operator_new(0xe8);
    ppBVar3 = std::
              vector<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
              ::at(&o->_m_LRFs,(ulong)uVar4);
    BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff(this_00,*ppBVar3);
    local_38 = this_00;
    std::vector<BayesianGameIdenticalPayoff*,std::allocator<BayesianGameIdenticalPayoff*>>::
    emplace_back<BayesianGameIdenticalPayoff*>
              ((vector<BayesianGameIdenticalPayoff*,std::allocator<BayesianGameIdenticalPayoff*>> *)
               &this->_m_LRFs,&local_38);
  }
  std::vector<Scope,_std::allocator<Scope>_>::operator=(&this->_m_agentScopes,&o->_m_agentScopes);
  return;
}

Assistant:

BayesianGameCollaborativeGraphical::BayesianGameCollaborativeGraphical(
    const BayesianGameCollaborativeGraphical& o) :
        BayesianGameIdenticalPayoffInterface(o)
{
    _m_nrLRFs = o._m_nrLRFs;
    if( o._m_jt_pd )
        _m_jt_pd = o._m_jt_pd->Clone();
    _m_LRFs.clear();
    for(Index i=0;i!=o._m_LRFs.size();++i)
        _m_LRFs.push_back(new BayesianGameIdenticalPayoff(*o._m_LRFs.at(i)));
    _m_agentScopes=o._m_agentScopes;
}